

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O1

void __thiscall roaring::Roaring::Roaring(Roaring *this,Roaring *r)

{
  _Bool _Var1;
  runtime_error *this_00;
  
  (this->roaring).high_low_container.keys = (uint16_t *)0x0;
  (this->roaring).high_low_container.typecodes = (uint8_t *)0x0;
  (this->roaring).high_low_container.size = 0;
  (this->roaring).high_low_container.allocation_size = 0;
  (this->roaring).high_low_container.containers = (container_s **)0x0;
  *(undefined8 *)&(this->roaring).high_low_container.flags = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)this,0);
  _Var1 = roaring_bitmap_overwrite((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  if (_Var1) {
    (this->roaring).high_low_container.flags =
         (this->roaring).high_low_container.flags & 0xfe | (r->roaring).high_low_container.flags & 1
    ;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed roaring_bitmap_overwrite in constructor");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Roaring(const Roaring &r) : Roaring() {
        if (!api::roaring_bitmap_overwrite(&roaring, &r.roaring)) {
            ROARING_TERMINATE("failed roaring_bitmap_overwrite in constructor");
        }
        api::roaring_bitmap_set_copy_on_write(
            &roaring, api::roaring_bitmap_get_copy_on_write(&r.roaring));
    }